

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RepairResponsePdu.cpp
# Opt level: O1

bool __thiscall DIS::RepairResponsePdu::operator==(RepairResponsePdu *this,RepairResponsePdu *rhs)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  
  bVar1 = LogisticsFamilyPdu::operator==
                    (&this->super_LogisticsFamilyPdu,&rhs->super_LogisticsFamilyPdu);
  bVar2 = EntityID::operator==(&this->_receivingEntityID,&rhs->_receivingEntityID);
  bVar3 = EntityID::operator==(&this->_repairingEntityID,&rhs->_repairingEntityID);
  return ((bVar3 && (bVar2 && bVar1)) && this->_repairResult == rhs->_repairResult) &&
         (this->_padding2 == rhs->_padding2 && this->_padding1 == rhs->_padding1);
}

Assistant:

bool RepairResponsePdu::operator ==(const RepairResponsePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = LogisticsFamilyPdu::operator==(rhs);

     if( ! (_receivingEntityID == rhs._receivingEntityID) ) ivarsEqual = false;
     if( ! (_repairingEntityID == rhs._repairingEntityID) ) ivarsEqual = false;
     if( ! (_repairResult == rhs._repairResult) ) ivarsEqual = false;
     if( ! (_padding1 == rhs._padding1) ) ivarsEqual = false;
     if( ! (_padding2 == rhs._padding2) ) ivarsEqual = false;

    return ivarsEqual;
 }